

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::update(QGraphicsScene *this,QRectF *rect)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QGraphicsView *this_00;
  QGraphicsViewPrivate *this_01;
  char cVar7;
  bool bVar8;
  long lVar9;
  QRectF *rect_00;
  long in_FS_OFFSET;
  QRectF local_a8;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  if ((*(byte *)(lVar4 + 0xb8) & 4) == 0) {
    dVar2 = rect->w;
    dVar3 = rect->h;
    if (((0.0 < dVar2) && (0.0 < dVar3)) ||
       ((dVar2 == 0.0 && (((!NAN(dVar2) && (dVar3 == 0.0)) && (!NAN(dVar3))))))) {
      cVar7 = QObjectPrivate::isSignalConnected((uint)lVar4,SUB41(*(undefined4 *)(lVar4 + 0x78),0));
      if (cVar7 == '\0') {
        bVar8 = *(long *)(lVar4 + 0x290) != 0;
      }
      else {
        bVar8 = false;
      }
      if (((rect->w != 0.0) || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))) {
        if (bVar8) {
          lVar5 = *(long *)(lVar4 + 0x288);
          lVar6 = *(long *)(lVar4 + 0x290);
          for (lVar9 = 0; lVar6 << 3 != lVar9; lVar9 = lVar9 + 8) {
            this_00 = *(QGraphicsView **)(lVar5 + lVar9);
            bVar8 = QGraphicsView::isTransformed(this_00);
            this_01 = *(QGraphicsViewPrivate **)(this_00 + 8);
            rect_00 = rect;
            if (bVar8) {
              QGraphicsView::viewportTransform(&local_88,this_00);
              QTransform::mapRect((QRectF *)&local_a8);
              rect_00 = &local_a8;
            }
            QGraphicsViewPrivate::updateRectF(this_01,rect_00);
          }
        }
        else {
          std::
          _Rb_tree<QRectF,QRectF,std::_Identity<QRectF>,QGraphicsScenePrivate::UpdatedRectsCmp,std::allocator<QRectF>>
          ::_M_insert_unique<QRectF_const&>
                    ((_Rb_tree<QRectF,QRectF,std::_Identity<QRectF>,QGraphicsScenePrivate::UpdatedRectsCmp,std::allocator<QRectF>>
                      *)(lVar4 + 0xe8),rect);
        }
      }
      else {
        *(byte *)(lVar4 + 0xb8) = *(byte *)(lVar4 + 0xb8) | 4;
        std::
        _Rb_tree<QRectF,_QRectF,_std::_Identity<QRectF>,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>
        ::clear((_Rb_tree<QRectF,_QRectF,_std::_Identity<QRectF>,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>
                 *)(lVar4 + 0xe8));
        if (bVar8) {
          lVar5 = *(long *)(lVar4 + 0x288);
          lVar6 = *(long *)(lVar4 + 0x290);
          for (lVar9 = 0; lVar6 << 3 != lVar9; lVar9 = lVar9 + 8) {
            puVar1 = (uint *)(*(long *)(*(long *)(lVar5 + lVar9) + 8) + 0x300);
            *puVar1 = *puVar1 | 0x1000;
          }
        }
      }
      if ((*(uint *)(lVar4 + 0xb8) & 8) == 0) {
        *(uint *)(lVar4 + 0xb8) = *(uint *)(lVar4 + 0xb8) | 8;
        QMetaObject::invokeMethod<>((QObject *)this,"_q_emitUpdated",QueuedConnection);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::update(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (d->updateAll || (rect.isEmpty() && !rect.isNull()))
        return;

    // Check if anyone's connected; if not, we can send updates directly to
    // the views. Otherwise or if there are no views, use old behavior.
    bool directUpdates = !(d->isSignalConnected(d->changedSignalIndex)) && !d->views.isEmpty();
    if (rect.isNull()) {
        d->updateAll = true;
        d->updatedRects.clear();
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views))
                view->d_func()->fullUpdatePending = true;
        }
    } else {
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views)) {
                if (view->isTransformed())
                    view->d_func()->updateRectF(view->viewportTransform().mapRect(rect));
                else
                    view->d_func()->updateRectF(rect);
            }
        } else {
            d->updatedRects.insert(rect);
        }
    }

    if (!d->calledEmitUpdated) {
        d->calledEmitUpdated = true;
        QMetaObject::invokeMethod(this, "_q_emitUpdated", Qt::QueuedConnection);
    }
}